

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::OptionValue::parse_default
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details)

{
  shared_ptr<const_cxxopts::OptionDetails> local_18;
  
  local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (details->super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ensure_value(this,&local_18);
  if (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_18.super___shared_ptr<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (*((this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Value[4])();
  return;
}

Assistant:

void
        parse_default(std::shared_ptr<const OptionDetails> details)
        {
            ensure_value(details);
            m_value->parse();
        }